

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_constexpr.cpp
# Opt level: O0

int main(void)

{
  char buf [256];
  char second [256];
  char first [2147483647];
  int buf_len;
  int second_len;
  int first_len;
  
  memcpy(&stack0x7ffffde8,second + 0xf8,0x7fffffff);
  memcpy(first + 0x7ffffdf7,buf + 0xf8,0x100);
  return 0;
}

Assistant:

int main() {
  const int first_len = std::numeric_limits<int>::max();
  const int second_len = 256;
  const int buf_len = 256;
  char first[first_len], second[second_len], buf[buf_len];

  // Undefined behavior (negative)
  if constexpr ((first_len + second_len) <= buf_len) {
    memcpy(buf, first, first_len);
    memcpy(buf + first_len, second, second_len);
  }
}